

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginPopupContextVoid(char *str_id,ImGuiMouseButton mouse_button)

{
  bool bVar1;
  ImGuiID id;
  char *str;
  
  str = "void_context";
  if (str_id != (char *)0x0) {
    str = str_id;
  }
  id = ImGuiWindow::GetID(GImGui->CurrentWindow,str,(char *)0x0);
  if ((uint)mouse_button < 5) {
    if ((GImGui->IO).MouseReleased[(uint)mouse_button] == true) {
      bVar1 = IsWindowHovered(4);
      if (!bVar1) {
        OpenPopupEx(id);
      }
    }
    bVar1 = BeginPopupEx(id,0x141);
    return bVar1;
  }
  __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*g.IO.MouseDown)))",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                ,0x1196,"bool ImGui::IsMouseReleased(ImGuiMouseButton)");
}

Assistant:

bool ImGui::BeginPopupContextVoid(const char* str_id, ImGuiMouseButton mouse_button)
{
    if (!str_id)
        str_id = "void_context";
    ImGuiID id = GImGui->CurrentWindow->GetID(str_id);
    if (IsMouseReleased(mouse_button) && !IsWindowHovered(ImGuiHoveredFlags_AnyWindow))
        OpenPopupEx(id);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoSavedSettings);
}